

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int canBiomeGenerate(int layerId,int mc,uint32_t flags,int id)

{
  bool bVar1;
  int iVar2;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int dofilter;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  bVar1 = false;
  if (0xf < (int)in_ESI) {
    if (in_EDI == 0x30) {
      iVar2 = isShallowOcean(in_ECX);
      return iVar2;
    }
    if (((in_EDX & 4) != 0) && (iVar2 = isOceanic(in_ECX), iVar2 != 0)) {
      return (uint)(in_ECX != 0x2f);
    }
  }
  if ((in_EDI == 0x15) && (bVar1 = true, 0x3f < in_ECX)) {
    local_4 = 0;
  }
  else if (((bVar1) || ((in_EDI == 0x16 && (0x10 < (int)in_ESI)))) &&
          ((bVar1 = true, in_ECX == 0x17 || ((in_ECX == 0x22 || (in_ECX == 0x25)))))) {
    local_4 = 0;
  }
  else {
    if ((bVar1) || ((in_EDI == 0x19 && (9 < (int)in_ESI)))) {
      bVar1 = true;
      if ((0x3f < in_ECX) && (in_ECX != 0xa8)) {
        return 0;
      }
      if ((((((in_ECX == 0xd) || (in_ECX - 0x11U < 3)) || (in_ECX == 0x16)) ||
           ((in_ECX == 0x1c || (in_ECX == 0x1f)))) || (in_ECX == 0x21)) ||
         (in_stack_ffffffffffffffe0 = in_ECX, in_ECX == 0x24)) {
        return 0;
      }
    }
    if (((bVar1) || ((in_EDI == 0x18 && ((int)in_ESI < 4)))) && (bVar1 = true, in_ECX == 0xf)) {
      local_4 = 0;
    }
    else if (((bVar1) || (in_EDI == 0x1d)) && (bVar1 = true, in_ECX == 10)) {
      local_4 = 0;
    }
    else if (((bVar1) || ((in_EDI == 0x21 && ((int)in_ESI < 10)))) && (bVar1 = true, in_ECX == 0x14)
            ) {
      local_4 = 0;
    }
    else {
      if ((bVar1) || ((in_EDI == 0x1e && (9 < (int)in_ESI)))) {
        bVar1 = true;
        in_stack_ffffffffffffffdc = in_ECX;
        if (in_ECX == 0xf) {
          if (in_ESI != 3) {
            return 0;
          }
        }
        else if ((in_ECX == 0x10) || (in_ECX == 0x19 || in_ECX == 0x1a)) {
          return 0;
        }
      }
      if (((bVar1) || (in_EDI == 0x22)) && (bVar1 = true, in_ECX == 7)) {
        local_4 = 0;
      }
      else if (((bVar1) || ((in_EDI == 0x23 && ((int)in_ESI < 10)))) &&
              (bVar1 = true, in_ECX == 0xb)) {
        local_4 = 0;
      }
      else {
        if ((bVar1) || (in_EDI == 0x2f)) {
          bVar1 = true;
          iVar2 = isDeepOcean(in_ECX);
          if ((iVar2 != 0) && (in_ECX != 0x18)) {
            return 0;
          }
          iVar2 = isShallowOcean(in_ECX);
          if (((iVar2 != 0) && (in_ECX != 0)) && ((9 < (int)in_ESI || (in_ECX != 10)))) {
            return 0;
          }
        }
        if ((bVar1) || ((in_EDI == 0x37 && (0xf < (int)in_ESI)))) {
          bVar1 = true;
        }
        if ((bVar1) || (in_EDI == 0x38)) {
          local_4 = isOverworld(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
        }
        else {
          printf("canBiomeGenerate(): unsupported layer (%d) or version (%d)\n",(ulong)in_EDI,
                 (ulong)in_ESI);
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int canBiomeGenerate(int layerId, int mc, uint32_t flags, int id)
{
    int dofilter = 0;

    if (mc >= MC_1_13)
    {
        if (layerId == L_OCEAN_TEMP_256)
            return isShallowOcean(id);
        if ((flags & FORCE_OCEAN_VARIANTS) && isOceanic(id))
            return id != deep_warm_ocean;
    }

    if (dofilter || layerId == L_BIOME_256)
    {
        dofilter = 1;
        if (id >= 64)
            return 0;
    }
    if (dofilter || (layerId == L_BAMBOO_256 && mc >= MC_1_14))
    {
        dofilter = 1;
        switch (id)
        {
        case jungle_edge:
        case wooded_mountains:
        case badlands:
            return 0;
        }
    }
    if (dofilter || (layerId == L_BIOME_EDGE_64 && mc >= MC_1_7))
    {
        dofilter = 1;
        if (id >= 64 && id != bamboo_jungle)
            return 0;
        switch (id)
        {
        case snowy_mountains:
        case desert_hills:
        case wooded_hills:
        case taiga_hills:
        case jungle_hills:
        case birch_forest_hills:
        case snowy_taiga_hills:
        case giant_tree_taiga_hills:
        case savanna_plateau:
            return 0;
        }
    }
    if (dofilter || (layerId == L_ZOOM_64 && mc <= MC_1_0))
    {
        dofilter = 1;
        if (id == mushroom_field_shore)
            return 0;
    }
    if (dofilter || layerId == L_HILLS_64)
    {
        dofilter = 1;
        if (id == frozen_ocean)
            return 0;
        // sunflower_plains actually generates at Hills layer as well
    }
    if (dofilter || (layerId == L_ZOOM_16 && mc <= MC_1_6))
    {
        dofilter = 1;
        if (id == mountain_edge)
            return 0;
    }
    if (dofilter || (layerId == L_SUNFLOWER_64 && mc >= MC_1_7))
    {
        dofilter = 1;
        switch (id)
        {
        case beach:
        case stone_shore:
        case snowy_beach:
            return 0;
        case mushroom_field_shore:
            if (mc != MC_1_0)
                return 0;
            break;
        }
    }
    if (dofilter || layerId == L_SHORE_16)
    {
        dofilter = 1;
        if (id == river)
            return 0;
    }
    if (dofilter || (layerId == L_SWAMP_RIVER_16 && mc <= MC_1_6))
    {
        dofilter = 1;
        if (id == frozen_river)
            return 0;
    }
    if (dofilter || layerId == L_RIVER_MIX_4)
    {
        dofilter = 1;
        if (isDeepOcean(id) && id != deep_ocean)
            return 0;
        if (isShallowOcean(id) && id != ocean)
        {
            if (mc >= MC_1_7 || id != frozen_ocean)
                return 0;
        }
    }
    if (dofilter || (layerId == L_OCEAN_MIX_4 && mc >= MC_1_13))
    {
        dofilter = 1;
    }

    if (!dofilter && layerId != L_VORONOI_1)
    {
        printf("canBiomeGenerate(): unsupported layer (%d) or version (%d)\n",
            layerId, mc);
        return 0;
    }
    return isOverworld(mc, id);
}